

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::Directed_Energy_Fire_PDU(Directed_Energy_Fire_PDU *this)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Directed_Energy_Fire_PDU_002235a8;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_FiringEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID);
  DATA_TYPE::EntityType::EntityType(&this->m_MunTyp);
  DATA_TYPE::ClockTime::ClockTime(&this->m_ShotStartTime);
  this->m_f32CumulativeShotTime = 0.0;
  DATA_TYPE::Vector::Vector(&this->m_EmitterLoc);
  this->m_f32AperDiameter = 0.0;
  this->m_f32Wavelength = 0.0;
  this->m_f32PeakIrradiance = 0.0;
  this->m_f32PulseRepFreq = 0.0;
  this->m_f32PulseWidth = 0.0;
  this->m_ui8PulseShp = '\0';
  this->m_ui8Padding1 = '\0';
  this->m_ui32Padding2 = 0;
  this->m_ui16Padding3 = 0;
  *(undefined8 *)&this->m_ui16NumDERecs = 0;
  *(undefined8 *)
   ((long)&(this->m_vDeRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 6) = 0;
  *(undefined8 *)
   ((long)&(this->m_vDeRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 6) = 0;
  *(undefined2 *)
   ((long)&(this->m_vDeRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 6) = 0;
  (this->super_Header).super_Header6.m_ui8PDUType = 'D';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x02';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x58;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\a';
  (this->m_DeUnion).m_ui16Flags = 0;
  return;
}

Assistant:

Directed_Energy_Fire_PDU::Directed_Energy_Fire_PDU() :
    m_f32CumulativeShotTime( 0 ),
    m_f32AperDiameter( 0 ),
    m_f32Wavelength( 0 ),
    m_f32PeakIrradiance( 0 ),
    m_f32PulseRepFreq( 0 ),
    m_f32PulseWidth( 0 ),
    m_ui8PulseShp( 0 ),
    m_ui8Padding1( 0 ),
    m_ui32Padding2( 0 ),
    m_ui16Padding3( 0 ),
    m_ui16NumDERecs( 0 )
{
    m_ui8PDUType = DirectedEnergyFire_PDU_Type;
    m_ui16PDULength = DIRECTED_ENERGY_PDU_SIZE;
    m_ui8ProtocolFamily = Warfare;
    m_ui8ProtocolVersion = IEEE_1278_1_2012;
    m_DeUnion.m_ui16Flags = 0;
}